

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.h
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<float>::ReallocMatRed(TPZDohrSubstructCondense<float> *this)

{
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x268) & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"TPZDohrSubstructCondense::ReallocMatRed\n");
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::ReallocForNuma
              ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)(in_RDI + 0x270),0);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
              ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)(in_RDI + 0x270));
    TPZMatRed<float,_TPZFMatrix<float>_>::ReallocSolver
              ((TPZMatRed<float,_TPZFMatrix<float>_> *)0x1fa76cb);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::ReallocForNuma
              ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)(in_RDI + 8),0);
    *(undefined1 *)(in_RDI + 0x268) = 1;
  }
  return;
}

Assistant:

void ReallocMatRed() 
		{
			if(!wasRealloc) {
				std::cout << "TPZDohrSubstructCondense::ReallocMatRed\n";
				fMatRed.ReallocForNuma(0);
                fMatRed->ReallocSolver();
				fMatRedComplete.ReallocForNuma(0);
                
				wasRealloc = true;
			}
		}